

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O3

void forward_DCT(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY sample_data,
                JBLOCKROW coef_blocks,JDIMENSION start_row,JDIMENSION start_col,
                JDIMENSION num_blocks)

{
  j_compress_ptr pjVar1;
  jpeg_forward_dct *pjVar2;
  _func_void_j_compress_ptr *p_Var3;
  _func_void_j_compress_ptr *p_Var4;
  j_compress_ptr pjVar5;
  JBLOCKROW paJVar6;
  JDIMENSION JVar7;
  ulong uVar8;
  _func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
  *p_Var9;
  
  if (num_blocks != 0) {
    pjVar2 = cinfo->fdct;
    p_Var3 = pjVar2[1].start_pass;
    p_Var9 = pjVar2[1].forward_DCT;
    p_Var4 = pjVar2[2].start_pass;
    pjVar5 = (j_compress_ptr)pjVar2[4].forward_DCT;
    paJVar6 = (JBLOCKROW)(ulong)start_row;
    pjVar1 = (j_compress_ptr)(sample_data + (long)paJVar6);
    uVar8 = (ulong)num_blocks;
    JVar7 = start_col;
    do {
      (*p_Var9)(pjVar1,(jpeg_component_info *)(ulong)JVar7,(JSAMPARRAY)pjVar5,paJVar6,start_row,
                start_col,(JDIMENSION)p_Var9);
      (*p_Var3)(pjVar5);
      (*p_Var4)((j_compress_ptr)coef_blocks);
      JVar7 = JVar7 + 8;
      coef_blocks = (JBLOCKROW)((j_compress_ptr)coef_blocks)->dc_huff_tbl_ptrs;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

METHODDEF(void)
forward_DCT(j_compress_ptr cinfo, jpeg_component_info *compptr,
            JSAMPARRAY sample_data, JBLOCKROW coef_blocks,
            JDIMENSION start_row, JDIMENSION start_col, JDIMENSION num_blocks)
/* This version is used for integer DCT implementations. */
{
  /* This routine is heavily used, so it's worth coding it tightly. */
  my_fdct_ptr fdct = (my_fdct_ptr)cinfo->fdct;
  DCTELEM *divisors = fdct->divisors[compptr->quant_tbl_no];
  DCTELEM *workspace;
  JDIMENSION bi;

  /* Make sure the compiler doesn't look up these every pass */
  forward_DCT_method_ptr do_dct = fdct->dct;
  convsamp_method_ptr do_convsamp = fdct->convsamp;
  quantize_method_ptr do_quantize = fdct->quantize;
  workspace = fdct->workspace;

  sample_data += start_row;     /* fold in the vertical offset once */

  for (bi = 0; bi < num_blocks; bi++, start_col += DCTSIZE) {
    /* Load data into workspace, applying unsigned->signed conversion */
    (*do_convsamp) (sample_data, start_col, workspace);

    /* Perform the DCT */
    (*do_dct) (workspace);

    /* Quantize/descale the coefficients, and store into coef_blocks[] */
    (*do_quantize) (coef_blocks[bi], divisors, workspace);
  }
}